

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O0

void __thiscall
QDuplicateTracker<QByteArray,_32UL>::QDuplicateTracker
          (QDuplicateTracker<QByteArray,_32UL> *this,qsizetype n)

{
  allocator_type *__a;
  monotonic_buffer_resource *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  unordered_set<QByteArray,_QDuplicateTracker<QByteArray,_32UL>::QHasher<QByteArray>,_std::equal_to<QByteArray>,_std::pmr::polymorphic_allocator<QByteArray>_>
  *this_00;
  polymorphic_allocator<std::__detail::_Hash_node<QByteArray,_true>_> local_8;
  
  local_8._M_resource = *(memory_resource **)(in_FS_OFFSET + 0x28);
  std::pmr::monotonic_buffer_resource::monotonic_buffer_resource
            (in_RSI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  __a = (allocator_type *)(in_RDI + 0x640);
  this_00 = (unordered_set<QByteArray,_QDuplicateTracker<QByteArray,_32UL>::QHasher<QByteArray>,_std::equal_to<QByteArray>,_std::pmr::polymorphic_allocator<QByteArray>_>
             *)&stack0xfffffffffffffff0;
  std::pmr::polymorphic_allocator<QByteArray>::polymorphic_allocator
            ((polymorphic_allocator<QByteArray> *)this_00,(memory_resource *)(in_RDI + 0x600));
  std::
  unordered_set<QByteArray,_QDuplicateTracker<QByteArray,_32UL>::QHasher<QByteArray>,_std::equal_to<QByteArray>,_std::pmr::polymorphic_allocator<QByteArray>_>
  ::unordered_set(this_00,(size_type)in_RSI,__a);
  if (*(memory_resource **)(in_FS_OFFSET + 0x28) == local_8._M_resource) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QDuplicateTracker(qsizetype n)
#ifdef __cpp_lib_memory_resource
        : set{size_t(n), &res}
#else
        : set{n}
#endif
    {}